

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker_base.hpp
# Opt level: O1

void __thiscall oqpi::worker_config::worker_config(worker_config *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"oqpi::worker","");
  (this->threadAttributes).name_._M_dataplus._M_p = (pointer)&(this->threadAttributes).name_.field_2
  ;
  std::__cxx11::string::_M_construct<char*>((string *)this,local_38,local_30 + (long)local_38);
  (this->threadAttributes).stackSize_ = 0;
  (this->threadAttributes).coreAffinityMask_ = all_cores;
  (this->threadAttributes).priority_ = normal;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  this->workerPrio = wprio_any;
  this->count = 1;
  return;
}

Assistant:

worker_config()
            : threadAttributes("oqpi::worker")
            , workerPrio(worker_priority::wprio_any)
            , count(1)
        {}